

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Match.cc
# Opt level: O2

void __thiscall flow::MatchSame::MatchSame(MatchSame *this,MatchDef *def,Program *program)

{
  pointer pMVar1;
  mapped_type mVar2;
  mapped_type *pmVar3;
  MatchCaseDef *one;
  pointer pMVar4;
  
  Match::Match(&this->super_Match,def);
  (this->super_Match)._vptr_Match = (_func_int **)&PTR__MatchSame_001b0a00;
  *(undefined8 *)&(this->map_)._M_h._M_rehash_policy = 0;
  (this->map_)._M_h._M_buckets = &(this->map_)._M_h._M_single_bucket;
  (this->map_)._M_h._M_bucket_count = 1;
  (this->map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->map_)._M_h._M_element_count = 0;
  (this->map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pMVar1 = (def->cases).super__Vector_base<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pMVar4 = (def->cases).
                super__Vector_base<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>._M_impl.
                super__Vector_impl_data._M_start; pMVar4 != pMVar1; pMVar4 = pMVar4 + 1) {
    mVar2 = pMVar4->pc;
    pmVar3 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->map_,
                          (program->cp_).strings_.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + pMVar4->label);
    *pmVar3 = mVar2;
  }
  return;
}

Assistant:

MatchSame::MatchSame(const MatchDef& def, Program* program)
    : Match(def),
      map_() {
  for (const auto& one : def.cases) {
    map_[program->constants().getString(one.label)] = one.pc;
  }
}